

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  U32 UVar2;
  size_t sVar3;
  undefined8 local_38;
  U32 local_30;
  
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x84b9,
                  "size_t ZSTD_compressBlock_btultra2(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (UVar2 = (ms->window).dictLimit, UVar2 == (ms->window).lowLimit)) &&
     ((8 < srcSize && (UVar2 == (int)src - *(int *)&(ms->window).base)))) {
    local_30 = rep[2];
    local_38 = *(undefined8 *)rep;
    if (1 < UVar2 - ms->nextToUpdate) {
      __assert_fail("ms->window.dictLimit - ms->nextToUpdate <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8495,
                    "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                   );
    }
    ZSTD_compressBlock_opt2(ms,seqStore,(U32 *)&local_38,src,srcSize,ZSTD_noDict);
    seqStore->lit = seqStore->litStart;
    seqStore->sequences = seqStore->sequencesStart;
    seqStore->longLengthType = ZSTD_llt_none;
    ppBVar1 = &(ms->window).base;
    *ppBVar1 = *ppBVar1 + -srcSize;
    UVar2 = (ms->window).dictLimit + (int)srcSize;
    (ms->window).dictLimit = UVar2;
    (ms->window).lowLimit = UVar2;
    ms->nextToUpdate = UVar2;
  }
  sVar3 = ZSTD_compressBlock_opt2(ms,seqStore,rep,src,srcSize,ZSTD_noDict);
  return sVar3;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const curr = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-passes strategy:
     * this strategy makes a first pass over first block to collect statistics
     * in order to seed next round's statistics with it.
     * After 1st pass, function forgets history, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
    ** the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (curr == ms->window.dictLimit)    /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD) /* input large enough to not employ default stats */
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt2(ms, seqStore, rep, src, srcSize, ZSTD_noDict);
}